

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O3

string * __thiscall
duckdb::Vector::ToString_abi_cxx11_(string *__return_storage_ptr__,Vector *this,idx_t count)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> **pp_Var3;
  uint uVar4;
  char cVar5;
  long *plVar6;
  undefined8 *puVar7;
  VectorBuffer *pVVar8;
  FSSTPrimitives *this_00;
  vector<unsigned_char,_true> *compressed_string_len;
  ulong *puVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  size_type *psVar11;
  ulong uVar12;
  void *duckdb_fsst_decoder;
  long lVar13;
  char cVar14;
  undefined8 uVar15;
  ulong uVar16;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var18;
  vector<unsigned_char,_true> *in_R9;
  uint __len;
  idx_t iVar19;
  ulong uVar20;
  string *retval;
  string __str_1;
  Value val;
  string __str;
  string_t compressed_string;
  string local_198;
  Value local_178;
  string local_138;
  long local_118;
  Value local_110;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **local_d0;
  uint local_c8;
  undefined4 uStack_c4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  long local_a8;
  long local_a0;
  undefined1 local_98 [32];
  string local_78;
  string local_50;
  
  VectorTypeToString_abi_cxx11_(&local_78,(duckdb *)(ulong)this->vector_type,(VectorType)count);
  plVar6 = (long *)::std::__cxx11::string::append((char *)&local_78);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_138.field_2._M_allocated_capacity = *puVar9;
    local_138.field_2._8_8_ = plVar6[3];
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  }
  else {
    local_138.field_2._M_allocated_capacity = *puVar9;
    local_138._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_138._M_string_length = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  LogicalType::ToString_abi_cxx11_((string *)local_98,&this->type);
  uVar15 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    uVar15 = local_138.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar15 < local_98._8_8_ + local_138._M_string_length) {
    in_R9 = (vector<unsigned_char,_true> *)(local_98 + 0x10);
    uVar16 = 0xf;
    if ((vector<unsigned_char,_true> *)local_98._0_8_ != in_R9) {
      uVar16 = local_98._16_8_;
    }
    if (uVar16 < local_98._8_8_ + local_138._M_string_length) goto LAB_00da57e7;
    puVar7 = (undefined8 *)
             ::std::__cxx11::string::replace
                       ((ulong)local_98,0,(char *)0x0,(ulong)local_138._M_dataplus._M_p);
  }
  else {
LAB_00da57e7:
    puVar7 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_138,local_98._0_8_);
  }
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  psVar11 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_198.field_2._M_allocated_capacity = *psVar11;
    local_198.field_2._8_8_ = puVar7[3];
  }
  else {
    local_198.field_2._M_allocated_capacity = *psVar11;
    local_198._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_198._M_string_length = puVar7[1];
  *puVar7 = psVar11;
  puVar7[1] = 0;
  *(undefined1 *)psVar11 = 0;
  plVar6 = (long *)::std::__cxx11::string::append((char *)&local_198);
  local_178.type_._0_8_ =
       &local_178.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  p_Var10 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(plVar6 + 2);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)*plVar6 == p_Var10) {
    local_178.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var10->_M_pi;
    local_178._24_8_ = plVar6[3];
  }
  else {
    local_178.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var10->_M_pi;
    local_178.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)*plVar6;
  }
  local_178.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)plVar6[1];
  *plVar6 = (long)p_Var10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  cVar14 = '\x01';
  if (9 < count) {
    iVar19 = count;
    cVar5 = '\x04';
    do {
      cVar14 = cVar5;
      if (iVar19 < 100) {
        cVar14 = cVar14 + -2;
        goto LAB_00da58fd;
      }
      if (iVar19 < 1000) {
        cVar14 = cVar14 + -1;
        goto LAB_00da58fd;
      }
      if (iVar19 < 10000) goto LAB_00da58fd;
      bVar2 = 99999 < iVar19;
      iVar19 = iVar19 / 10000;
      cVar5 = cVar14 + '\x04';
    } while (bVar2);
    cVar14 = cVar14 + '\x01';
  }
LAB_00da58fd:
  local_d0 = local_c0;
  ::std::__cxx11::string::_M_construct((ulong)&local_d0,cVar14);
  ::std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_d0,local_c8,count);
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(local_178.type_.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   _vptr_ExtraTypeInfo + CONCAT44(uStack_c4,local_c8));
  _Var17._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_178.type_._0_8_ !=
      &local_178.type_.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
    _Var17._M_pi = local_178.type_.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
  }
  if (_Var17._M_pi < p_Var1) {
    p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
    if (local_d0 != local_c0) {
      p_Var18 = local_c0[0];
    }
    if (p_Var1 <= p_Var18) {
      puVar7 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,local_178.type_._0_8_)
      ;
      goto LAB_00da599d;
    }
  }
  puVar7 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_d0);
LAB_00da599d:
  local_110.type_._0_8_ =
       &local_110.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  p_Var10 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar7 + 2);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)*puVar7 == p_Var10) {
    local_110.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var10->_M_pi;
    local_110._24_8_ = puVar7[3];
  }
  else {
    local_110.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var10->_M_pi;
    local_110.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)*puVar7;
  }
  local_110.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)puVar7[1];
  *puVar7 = p_Var10;
  puVar7[1] = 0;
  *(undefined1 *)&p_Var10->_M_pi = 0;
  plVar6 = (long *)::std::__cxx11::string::append((char *)&local_110);
  local_b0 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_b0;
  psVar11 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar11) {
    lVar13 = plVar6[3];
    local_b0->_M_allocated_capacity = *psVar11;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar13;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
  }
  __return_storage_ptr__->_M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_110.type_._0_8_ !=
      &local_110.type_.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
    operator_delete((void *)local_110.type_._0_8_);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_178.type_._0_8_ !=
      &local_178.type_.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
    operator_delete((void *)local_178.type_._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  if ((vector<unsigned_char,_true> *)local_98._0_8_ !=
      (vector<unsigned_char,_true> *)(local_98 + 0x10)) {
    operator_delete((void *)local_98._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  switch(this->vector_type) {
  case FLAT_VECTOR:
  case DICTIONARY_VECTOR:
    if (count != 0) {
      iVar19 = 0;
      do {
        GetValue(&local_110,this,iVar19);
        Value::ToString_abi_cxx11_(&local_198,&local_110);
        puVar7 = (undefined8 *)::std::__cxx11::string::append((char *)&local_198);
        local_178.type_._0_8_ =
             &local_178.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        p_Var10 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar7 + 2);
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)*puVar7 == p_Var10) {
          local_178.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               p_Var10->_M_pi;
          local_178._24_8_ = puVar7[3];
        }
        else {
          local_178.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               p_Var10->_M_pi;
          local_178.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)*puVar7;
        }
        local_178.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)puVar7[1];
        *puVar7 = p_Var10;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_178.type_._0_8_);
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_178.type_._0_8_ !=
            &local_178.type_.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
          operator_delete((void *)local_178.type_._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p);
        }
        Value::~Value(&local_110);
        iVar19 = iVar19 + 1;
      } while (count != iVar19);
    }
    break;
  case FSST_VECTOR:
    if (count != 0) {
      local_118 = count - 1;
      lVar13 = 0;
      iVar19 = 0;
      do {
        local_78._M_dataplus._M_p = *(pointer *)(this->data + lVar13);
        local_78._M_string_length = *(size_type *)(this->data + lVar13 + 8);
        this_00 = (FSSTPrimitives *)FSSTVector::GetDecoder(this);
        compressed_string_len = FSSTVector::GetDecompressBuffer(this);
        duckdb_fsst_decoder = (void *)((long)&local_78._M_dataplus._M_p + 4);
        if ((char *)0xc < (char *)((ulong)local_78._M_dataplus._M_p & 0xffffffff)) {
          duckdb_fsst_decoder = (void *)local_78._M_string_length;
        }
        FSSTPrimitives::DecompressValue_abi_cxx11_
                  (&local_50,this_00,duckdb_fsst_decoder,
                   (char *)((ulong)local_78._M_dataplus._M_p & 0xffffffff),
                   (idx_t)compressed_string_len,in_R9);
        Value::Value(&local_110,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        GetValue(&local_178,this,iVar19);
        Value::ToString_abi_cxx11_(&local_138,&local_178);
        puVar7 = (undefined8 *)::std::__cxx11::string::append((char *)&local_138);
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        psVar11 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_198.field_2._M_allocated_capacity = *psVar11;
          local_198.field_2._8_8_ = puVar7[3];
        }
        else {
          local_198.field_2._M_allocated_capacity = *psVar11;
          local_198._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_198._M_string_length = puVar7[1];
        *puVar7 = psVar11;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_198._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p);
        }
        Value::~Value(&local_178);
        Value::~Value(&local_110);
        iVar19 = iVar19 + 1;
        lVar13 = lVar13 + 0x10;
      } while (count != iVar19);
    }
    break;
  case CONSTANT_VECTOR:
    GetValue(&local_110,this,0);
    Value::ToString_abi_cxx11_((string *)&local_178,&local_110);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_178.type_._0_8_);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_178.type_._0_8_ !=
        &local_178.type_.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
      operator_delete((void *)local_178.type_._0_8_);
    }
    Value::~Value(&local_110);
    break;
  case SEQUENCE_VECTOR:
    pVVar8 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&this->buffer);
    if (count != 0) {
      plVar6 = (long *)(pVVar8->data).pointer;
      local_118 = *plVar6;
      local_a0 = plVar6[1];
      local_a8 = count - 1;
      iVar19 = 0;
      do {
        uVar20 = iVar19 * local_a0 + local_118;
        uVar16 = -uVar20;
        if (0 < (long)uVar20) {
          uVar16 = uVar20;
        }
        __len = 1;
        if (9 < uVar16) {
          uVar12 = uVar16;
          uVar4 = 4;
          do {
            __len = uVar4;
            if (uVar12 < 100) {
              __len = __len - 2;
              goto LAB_00da5cbe;
            }
            if (uVar12 < 1000) {
              __len = __len - 1;
              goto LAB_00da5cbe;
            }
            if (uVar12 < 10000) goto LAB_00da5cbe;
            bVar2 = 99999 < uVar12;
            uVar12 = uVar12 / 10000;
            uVar4 = __len + 4;
          } while (bVar2);
          __len = __len + 1;
        }
LAB_00da5cbe:
        local_178.type_._0_8_ =
             &local_178.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        ::std::__cxx11::string::_M_construct
                  ((ulong)&local_178,(char)__len - (char)((long)uVar20 >> 0x3f));
        ::std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)(local_178.type_._0_8_ + -((long)uVar20 >> 0x3f)),__len,uVar16);
        puVar7 = (undefined8 *)::std::__cxx11::string::append((char *)&local_178);
        pp_Var3 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
                  &local_110.type_.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ;
        p_Var10 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar7 + 2);
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)*puVar7 == p_Var10) {
          local_110.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               p_Var10->_M_pi;
          local_110._24_8_ = puVar7[3];
          local_110.type_._0_8_ = pp_Var3;
        }
        else {
          local_110.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               p_Var10->_M_pi;
          local_110.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)*puVar7;
        }
        local_110.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)puVar7[1];
        *puVar7 = p_Var10;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_110.type_._0_8_);
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_110.type_._0_8_ != pp_Var3) {
          operator_delete((void *)local_110.type_._0_8_);
        }
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_178.type_._0_8_ !=
            &local_178.type_.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
          operator_delete((void *)local_178.type_._0_8_);
        }
        iVar19 = iVar19 + 1;
      } while (iVar19 != count);
    }
    break;
  default:
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string Vector::ToString(idx_t count) const {
	string retval =
	    VectorTypeToString(GetVectorType()) + " " + GetType().ToString() + ": " + to_string(count) + " = [ ";
	switch (GetVectorType()) {
	case VectorType::FLAT_VECTOR:
	case VectorType::DICTIONARY_VECTOR:
		for (idx_t i = 0; i < count; i++) {
			retval += GetValue(i).ToString() + (i == count - 1 ? "" : ", ");
		}
		break;
	case VectorType::FSST_VECTOR: {
		for (idx_t i = 0; i < count; i++) {
			string_t compressed_string = reinterpret_cast<string_t *>(data)[i];
			auto decoder = FSSTVector::GetDecoder(*this);
			auto &decompress_buffer = FSSTVector::GetDecompressBuffer(*this);
			Value val = FSSTPrimitives::DecompressValue(decoder, compressed_string.GetData(),
			                                            compressed_string.GetSize(), decompress_buffer);
			retval += GetValue(i).ToString() + (i == count - 1 ? "" : ", ");
		}
	} break;
	case VectorType::CONSTANT_VECTOR:
		retval += GetValue(0).ToString();
		break;
	case VectorType::SEQUENCE_VECTOR: {
		int64_t start, increment;
		SequenceVector::GetSequence(*this, start, increment);
		for (idx_t i = 0; i < count; i++) {
			retval += to_string(start + increment * UnsafeNumericCast<int64_t>(i)) + (i == count - 1 ? "" : ", ");
		}
		break;
	}
	default:
		retval += "UNKNOWN VECTOR TYPE";
		break;
	}
	retval += "]";
	return retval;
}